

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::CodeGeneratorResponse_File::Clear(CodeGeneratorResponse_File *this)

{
  bool bVar1;
  string *psVar2;
  LogMessage *pLVar3;
  LogFinisher local_10a;
  byte local_109;
  LogMessage local_108;
  LogFinisher local_ca;
  byte local_c9;
  LogMessage local_c8;
  LogFinisher local_8d [20];
  byte local_79;
  LogMessage local_78;
  CodeGeneratorResponse_File *local_40;
  CodeGeneratorResponse_File *this_local;
  HasBits<1UL> *local_30;
  HasBits<1UL> *local_28;
  InternalMetadataWithArena *local_20;
  InternalMetadataWithArena *local_18;
  InternalMetadataWithArena *local_10;
  
  local_30 = &this->_has_bits_;
  this_local._4_4_ = 0;
  local_40 = this;
  if ((local_30->has_bits_[0] & 7) != 0) {
    bVar1 = has_name(this);
    if (bVar1) {
      psVar2 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
      bVar1 = internal::ArenaStringPtr::IsDefault(&this->name_,psVar2);
      local_79 = 0;
      if (bVar1) {
        internal::LogMessage::LogMessage
                  (&local_78,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/plugin.pb.cc"
                   ,0x59a);
        local_79 = 1;
        pLVar3 = internal::LogMessage::operator<<
                           (&local_78,
                            "CHECK failed: !name_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                           );
        internal::LogFinisher::operator=(local_8d,pLVar3);
      }
      if ((local_79 & 1) != 0) {
        internal::LogMessage::~LogMessage(&local_78);
      }
      internal::ArenaStringPtr::UnsafeRawStringPointer_abi_cxx11_(&this->name_);
      std::__cxx11::string::clear();
    }
    bVar1 = has_insertion_point(this);
    if (bVar1) {
      psVar2 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
      bVar1 = internal::ArenaStringPtr::IsDefault(&this->insertion_point_,psVar2);
      local_c9 = 0;
      if (bVar1) {
        internal::LogMessage::LogMessage
                  (&local_c8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/plugin.pb.cc"
                   ,0x59e);
        local_c9 = 1;
        pLVar3 = internal::LogMessage::operator<<
                           (&local_c8,
                            "CHECK failed: !insertion_point_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                           );
        internal::LogFinisher::operator=(&local_ca,pLVar3);
      }
      if ((local_c9 & 1) != 0) {
        internal::LogMessage::~LogMessage(&local_c8);
      }
      internal::ArenaStringPtr::UnsafeRawStringPointer_abi_cxx11_(&this->insertion_point_);
      std::__cxx11::string::clear();
    }
    bVar1 = has_content(this);
    if (bVar1) {
      psVar2 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
      bVar1 = internal::ArenaStringPtr::IsDefault(&this->content_,psVar2);
      local_109 = 0;
      if (bVar1) {
        internal::LogMessage::LogMessage
                  (&local_108,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/plugin.pb.cc"
                   ,0x5a2);
        local_109 = 1;
        pLVar3 = internal::LogMessage::operator<<
                           (&local_108,
                            "CHECK failed: !content_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                           );
        internal::LogFinisher::operator=(&local_10a,pLVar3);
      }
      if ((local_109 & 1) != 0) {
        internal::LogMessage::~LogMessage(&local_108);
      }
      internal::ArenaStringPtr::UnsafeRawStringPointer_abi_cxx11_(&this->content_);
      std::__cxx11::string::clear();
    }
  }
  local_28 = &this->_has_bits_;
  memset(local_28,0,4);
  local_20 = &this->_internal_metadata_;
  if (((uint)(local_20->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    local_18 = local_20;
    local_10 = local_20;
    internal::InternalMetadataWithArena::DoClear(local_20);
  }
  return;
}

Assistant:

void CodeGeneratorResponse_File::Clear() {
// @@protoc_insertion_point(message_clear_start:google.protobuf.compiler.CodeGeneratorResponse.File)
  if (_has_bits_[0 / 32] & 7u) {
    if (has_name()) {
      GOOGLE_DCHECK(!name_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
      (*name_.UnsafeRawStringPointer())->clear();
    }
    if (has_insertion_point()) {
      GOOGLE_DCHECK(!insertion_point_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
      (*insertion_point_.UnsafeRawStringPointer())->clear();
    }
    if (has_content()) {
      GOOGLE_DCHECK(!content_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
      (*content_.UnsafeRawStringPointer())->clear();
    }
  }
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}